

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSource.cpp
# Opt level: O1

int __thiscall csv::icu::FileDataSource::open(FileDataSource *this,char *__file,int __oflag,...)

{
  size_t sVar1;
  UFILE *pUVar2;
  FILE *__stream;
  long lVar3;
  int iVar4;
  char *__s;
  string file_codepage;
  detected_language detected;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  detected_language local_70;
  
  if (this->_in != (UFILE *)0x0) {
    u_fclose_70();
    this->_in = (UFILE *)0x0;
  }
  __s = "";
  if (___oflag != (char *)0x0) {
    __s = ___oflag;
  }
  local_90 = local_80;
  sVar1 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,__s + sVar1);
  if (local_88 == 0) {
    encoding::TextEncodingForFile(&local_70,__file);
    if (local_70.name._M_string_length == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.language._M_dataplus._M_p != &local_70.language.field_2) {
        operator_delete(local_70.language._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
        operator_delete(local_70.name._M_dataplus._M_p);
      }
      iVar4 = 0;
      goto LAB_00116935;
    }
    std::__cxx11::string::_M_assign((string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.language._M_dataplus._M_p != &local_70.language.field_2) {
      operator_delete(local_70.language._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
      operator_delete(local_70.name._M_dataplus._M_p);
    }
  }
  pUVar2 = (UFILE *)u_fopen_70(__file,"rb",0,local_90);
  this->_in = pUVar2;
  if (pUVar2 != (UFILE *)0x0) {
    __stream = (FILE *)u_fgetfile_70(pUVar2);
    fseek(__stream,0,2);
    lVar3 = ftell(__stream);
    this->_length = lVar3;
    fseek(__stream,0,0);
  }
  iVar4 = (int)CONCAT71((int7)((ulong)this >> 8),this->_in != (UFILE *)0x0);
LAB_00116935:
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  return iVar4;
}

Assistant:

bool FileDataSource::open(const char* file, const char* codepage) {

		// Close if we have one open already
		close();

		std::string file_codepage = codepage ?: "";
		if (file_codepage.length() == 0) {
			const auto detected = encoding::TextEncodingForFile(file);
			if (detected.invalid()) {
				return false;
			}
			file_codepage = detected.name;
		}

		_in = u_fopen(file, "rb", NULL, file_codepage.c_str());
		if (_in != NULL) {
			FILE* internal_file = u_fgetfile(_in);
			fseek(internal_file, 0L, SEEK_END);
			_length = ftell(internal_file);
			fseek(internal_file, 0L, SEEK_SET);
		}

		return _in != NULL;
	}